

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  enable_if_t<std::is_integral_v<int>,_int> eVar3;
  uint uVar4;
  uint uVar5;
  enable_if_t<std::is_integral_v<int>,_int> eVar6;
  Tuple2<pbrt::Point2,_int> allocator;
  float *pfVar7;
  Allocator alloc;
  long lVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args_1;
  char *message;
  int x;
  int iVar9;
  int y;
  int iVar10;
  undefined1 auVar11 [16];
  Float FVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Bounds2iIterator BVar17;
  double ref;
  Array2D<float> v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  int local_cc;
  AssertionResult gtest_ar;
  Bounds2iIterator __begin3;
  AssertHelper local_90;
  double s;
  Bounds2i local_80;
  SummedAreaTable sat;
  Bounds2f bf;
  RNG rng;
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 8) {
    uVar1 = *(undefined8 *)((long)&DAT_0052d9d0 + lVar8);
    allocator = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource();
    pbrt::Array2D<float>::Array2D
              (&v,(int)uVar1,(int)((ulong)uVar1 >> 0x20),(allocator_type)allocator);
    for (iVar10 = 0;
        iVar10 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                 v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y; iVar10 = iVar10 + 1) {
      for (iVar9 = 0;
          iVar9 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                  v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x; iVar9 = iVar9 + 1) {
        eVar3 = pbrt::RNG::Uniform<int>(&rng,0x20);
        pfVar7 = pbrt::Array2D<float>::operator()(&v,iVar9,iVar10);
        *pfVar7 = (float)eVar3;
      }
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable(&sat,&v,alloc);
    iVar10 = 0;
    while (iVar9 = allocator.y, iVar10 != 100) {
      local_cc = iVar10;
      uVar4 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      eVar3 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      uVar5 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      eVar6 = pbrt::RNG::Uniform<int>
                        (&rng,v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                              v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      auVar15._4_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar15._0_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar16._4_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar16._0_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar11 = vpinsrd_avx(ZEXT416(uVar5),eVar6,1);
      auVar14 = vpinsrd_avx(ZEXT416(uVar4),eVar3,1);
      auVar13 = vpminsd_avx(auVar11,auVar14);
      auVar2 = vpmaxsd_avx(auVar14,auVar11);
      auVar11 = vcvtdq2ps_avx(auVar13);
      local_80.pMin.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)(CONCAT44(iVar9,auVar13._0_4_) | (ulong)auVar13._4_4_ << 0x20)
      ;
      auVar14 = vcvtdq2ps_avx(auVar2);
      allocator = (Tuple2<pbrt::Point2,_int>)
                  (CONCAT44(local_80.pMin.super_Tuple2<pbrt::Point2,_int>.y,auVar2._0_4_) |
                  (ulong)auVar2._4_4_ << 0x20);
      auVar15._8_8_ = 0;
      auVar16._8_8_ = 0;
      auVar2 = vpsubd_avx(auVar15,auVar16);
      auVar2 = vcvtdq2ps_avx(auVar2);
      auVar11 = vdivps_avx(auVar11,auVar2);
      auVar14 = vdivps_avx(auVar14,auVar2);
      __begin3.p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlps_avx(auVar11);
      gtest_ar._0_8_ = vmovlps_avx(auVar14);
      local_80.pMax.super_Tuple2<pbrt::Point2,_int> = allocator;
      pbrt::Bounds2<float>::Bounds2(&bf,(Point2<float> *)&__begin3,(Point2<float> *)&gtest_ar);
      ref = 0.0;
      __begin3.bounds = &local_80;
      __begin3.p.super_Tuple2<pbrt::Point2,_int> = local_80.pMin.super_Tuple2<pbrt::Point2,_int>;
      BVar17 = pbrt::end(__begin3.bounds);
      while (((__begin3.p.super_Tuple2<pbrt::Point2,_int>.x !=
               BVar17.p.super_Tuple2<pbrt::Point2,_int>.x ||
              (__begin3.p.super_Tuple2<pbrt::Point2,_int>.y !=
               BVar17.p.super_Tuple2<pbrt::Point2,_int>.y)) || (__begin3.bounds != BVar17.bounds)))
      {
        allocator.x = 0;
        allocator.y = 0;
        ref = (double)v.values[(v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                               (__begin3.p.super_Tuple2<pbrt::Point2,_int>.y -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                               (__begin3.p.super_Tuple2<pbrt::Point2,_int>.x -
                               v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)] + ref;
        pbrt::Bounds2iIterator::operator++(&__begin3);
      }
      auVar11._4_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar11._0_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar14._4_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar14._0_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar11._8_8_ = 0;
      auVar14._8_8_ = 0;
      auVar14 = vpsubd_avx(auVar11,auVar14);
      auVar11 = vpshufd_avx(auVar14,0x55);
      auVar11 = vpmulld_avx(auVar11,auVar14);
      auVar11 = vcvtdq2pd_avx(auVar11);
      ref = ref / auVar11._0_8_;
      FVar12 = pbrt::SummedAreaTable::Integral(&sat,&bf);
      s = (double)FVar12;
      if ((ref != s) || (NAN(ref) || NAN(s))) {
        local_d8.ptr_._0_4_ = 0x3a83126f;
        auVar13._0_8_ = (ref - s) / ref;
        auVar13._8_8_ = 0;
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        auVar11 = vandpd_avx512vl(auVar13,auVar2);
        __begin3.p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlpd_avx(auVar11)
        ;
        allocator = (Tuple2<pbrt::Point2,_int>)&__begin3;
        args_1 = &local_d8;
        testing::internal::CmpHelperLT<double,float>
                  ((internal *)&gtest_ar,"std::abs((ref - s) / ref)","1e-3f",(double *)&__begin3,
                   (float *)&local_d8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_d8);
          pbrt::StringPrintf<double&,double&>
                    ((string *)&__begin3,(pbrt *)"ref %f s %f",(char *)&ref,&s,(double *)args_1);
          std::operator<<((ostream *)(CONCAT44(local_d8.ptr_._4_4_,local_d8.ptr_._0_4_) + 0x10),
                          (string *)&__begin3);
          message = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          allocator.x = 0;
          allocator.y = 0;
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                     ,0x51d,message);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          std::__cxx11::string::~string((string *)&__begin3);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_d8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      iVar10 = local_cc + 1;
    }
    pbrt::Array2D<double>::~Array2D(&sat.sum);
    pbrt::Array2D<float>::~Array2D(&v);
  }
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Integral(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}